

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char * QUtf16::convertFromUnicode(char *out,QStringView in,State *state,DataEndianness endian)

{
  qsizetype qVar1;
  long in_RCX;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool writeBom;
  QChar bom;
  void *in_stack_ffffffffffffffa8;
  QFlags<QStringConverterBase::Flag> *in_stack_ffffffffffffffb0;
  bool local_36;
  int local_34;
  long local_28;
  QChar local_1e;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_36 = false;
  if ((*(uint *)(in_RCX + 4) & 1) == 0) {
    local_1c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorage<QStringConverterBase::Flag>)
         QFlags<QStringConverterBase::Flag>::operator&
                   (in_stack_ffffffffffffffb0,(Flag)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    local_36 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  }
  local_34 = in_R8D;
  if (in_R8D == 0) {
    local_34 = 2;
  }
  local_28 = in_RDI;
  if (local_36 != false) {
    local_1e.ucs = L'ꪪ';
    QChar::QChar<QChar::SpecialCharacter,_true>(&local_1e,ByteOrderMark);
    if (local_34 == 1) {
      QChar::unicode(&local_1e);
      qToBigEndian<char16_t>
                ((char16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30),in_stack_ffffffffffffffa8);
    }
    else {
      QChar::unicode(&local_1e);
      qToLittleEndian<char16_t>
                ((char16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30),in_stack_ffffffffffffffa8);
    }
    local_28 = in_RDI + 2;
  }
  if (local_34 == 1) {
    QStringView::data(&local_18);
    QStringView::size(&local_18);
    qToBigEndian<char16_t>
              (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8,(void *)0x542a5e);
  }
  else {
    QStringView::data(&local_18);
    QStringView::size(&local_18);
    qToLittleEndian<char16_t>
              (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8,(void *)0x542a8b);
  }
  *(undefined8 *)(in_RCX + 8) = 0;
  *(uint *)(in_RCX + 4) = *(uint *)(in_RCX + 4) | 1;
  qVar1 = QStringView::size(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (char *)(local_28 + qVar1 * 2);
  }
  __stack_chk_fail();
}

Assistant:

char *QUtf16::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    Q_ASSERT(state);
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;

    if (endian == DetectEndianness)
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;

    if (writeBom) {
        // set them up the BOM
        QChar bom(QChar::ByteOrderMark);
        if (endian == BigEndianness)
            qToBigEndian(bom.unicode(), out);
        else
            qToLittleEndian(bom.unicode(), out);
        out += 2;
    }
    if (endian == BigEndianness)
        qToBigEndian<char16_t>(in.data(), in.size(), out);
    else
        qToLittleEndian<char16_t>(in.data(), in.size(), out);

    state->remainingChars = 0;
    state->internalState |= HeaderDone;
    return out + 2*in.size();
}